

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DeleteTrigger(sqlite3 *db,Trigger *pTrigger)

{
  sqlite3 *in_RSI;
  TriggerStep *in_stack_ffffffffffffffe8;
  
  if ((in_RSI != (sqlite3 *)0x0) && (*(char *)((long)&in_RSI->pDfltColl + 2) == '\0')) {
    sqlite3DeleteTriggerStep(in_RSI,in_stack_ffffffffffffffe8);
    sqlite3DbFree(in_RSI,in_stack_ffffffffffffffe8);
    sqlite3DbFree(in_RSI,in_stack_ffffffffffffffe8);
    sqlite3ExprDelete(in_RSI,(Expr *)in_stack_ffffffffffffffe8);
    sqlite3IdListDelete(in_RSI,(IdList *)in_stack_ffffffffffffffe8);
    sqlite3DbFree(in_RSI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteTrigger(sqlite3 *db, Trigger *pTrigger){
  if( pTrigger==0 || pTrigger->bReturning ) return;
  sqlite3DeleteTriggerStep(db, pTrigger->step_list);
  sqlite3DbFree(db, pTrigger->zName);
  sqlite3DbFree(db, pTrigger->table);
  sqlite3ExprDelete(db, pTrigger->pWhen);
  sqlite3IdListDelete(db, pTrigger->pColumns);
  sqlite3DbFree(db, pTrigger);
}